

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regspace.c
# Opt level: O1

int nva_rstype(char *name)

{
  int iVar1;
  int iVar2;
  
  iVar1 = strcmp(name,"bar0");
  iVar2 = 0;
  if (iVar1 != 0) {
    iVar1 = strcmp(name,"mmio");
    iVar2 = 0;
    if (iVar1 != 0) {
      iVar1 = strcmp(name,"bar1");
      iVar2 = 1;
      if (iVar1 != 0) {
        iVar1 = strcmp(name,"fb");
        if (iVar1 != 0) {
          iVar1 = strcmp(name,"bar2");
          iVar2 = 2;
          if (iVar1 != 0) {
            iVar1 = strcmp(name,"bar3");
            if (iVar1 != 0) {
              iVar1 = strcmp(name,"ramin");
              if (iVar1 != 0) {
                iVar2 = strcmp(name,"iobar");
                if (iVar2 == 0) {
                  iVar2 = 3;
                }
                else {
                  iVar2 = strcmp(name,"rawmem");
                  if (iVar2 == 0) {
                    iVar2 = 4;
                  }
                  else {
                    iVar2 = strcmp(name,"rawio");
                    if (iVar2 == 0) {
                      iVar2 = 5;
                    }
                    else {
                      iVar2 = strcmp(name,"pdac");
                      if (iVar2 == 0) {
                        iVar2 = 6;
                      }
                      else {
                        iVar2 = strcmp(name,"eeprom");
                        if (iVar2 == 0) {
                          iVar2 = 7;
                        }
                        else {
                          iVar2 = strcmp(name,"cr");
                          if (iVar2 == 0) {
                            iVar2 = 8;
                          }
                          else {
                            iVar2 = strcmp(name,"sr");
                            if (iVar2 == 0) {
                              iVar2 = 9;
                            }
                            else {
                              iVar2 = strcmp(name,"gr");
                              if (iVar2 == 0) {
                                iVar2 = 0xb;
                              }
                              else {
                                iVar2 = strcmp(name,"ar");
                                if (iVar2 == 0) {
                                  iVar2 = 10;
                                }
                                else {
                                  iVar2 = strcmp(name,"vst");
                                  if (iVar2 == 0) {
                                    iVar2 = 0xc;
                                  }
                                  else {
                                    iVar2 = strcmp(name,"dpram");
                                    if (iVar2 == 0) {
                                      iVar2 = 0xd;
                                    }
                                    else {
                                      iVar2 = strcmp(name,"pipe");
                                      if (iVar2 == 0) {
                                        iVar2 = 0xe;
                                      }
                                      else {
                                        iVar2 = strcmp(name,"rdi");
                                        if (iVar2 == 0) {
                                          iVar2 = 0xf;
                                        }
                                        else {
                                          iVar2 = strcmp(name,"rdib");
                                          if (iVar2 == 0) {
                                            iVar2 = 0x10;
                                          }
                                          else {
                                            iVar2 = strcmp(name,"vcomp_code");
                                            if (iVar2 == 0) {
                                              iVar2 = 0x11;
                                            }
                                            else {
                                              iVar2 = strcmp(name,"vcomp_reg");
                                              if (iVar2 == 0) {
                                                iVar2 = 0x12;
                                              }
                                              else {
                                                iVar2 = strcmp(name,"macro_code");
                                                if (iVar2 == 0) {
                                                  iVar2 = 0x13;
                                                }
                                                else {
                                                  iVar2 = strcmp(name,"xt");
                                                  iVar2 = 0x15 - (uint)(iVar2 == 0);
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int nva_rstype(const char *name) {
	if (!strcmp(name, "bar0"))
		return NVA_REGSPACE_BAR0;
	if (!strcmp(name, "mmio"))
		return NVA_REGSPACE_BAR0;
	if (!strcmp(name, "bar1"))
		return NVA_REGSPACE_BAR1;
	if (!strcmp(name, "fb"))
		return NVA_REGSPACE_BAR1;
	if (!strcmp(name, "bar2"))
		return NVA_REGSPACE_BAR2;
	if (!strcmp(name, "bar3"))
		return NVA_REGSPACE_BAR2;
	if (!strcmp(name, "ramin"))
		return NVA_REGSPACE_BAR2;
	if (!strcmp(name, "iobar"))
		return NVA_REGSPACE_IOBAR;
	if (!strcmp(name, "rawmem"))
		return NVA_REGSPACE_RAWMEM;
	if (!strcmp(name, "rawio"))
		return NVA_REGSPACE_RAWIO;
	if (!strcmp(name, "pdac"))
		return NVA_REGSPACE_PDAC;
	if (!strcmp(name, "eeprom"))
		return NVA_REGSPACE_EEPROM;
	if (!strcmp(name, "cr"))
		return NVA_REGSPACE_VGA_CR;
	if (!strcmp(name, "sr"))
		return NVA_REGSPACE_VGA_SR;
	if (!strcmp(name, "gr"))
		return NVA_REGSPACE_VGA_GR;
	if (!strcmp(name, "ar"))
		return NVA_REGSPACE_VGA_AR;
	if (!strcmp(name, "cr"))
		return NVA_REGSPACE_VGA_CR;
	if (!strcmp(name, "vst"))
		return NVA_REGSPACE_VGA_ST;
	if (!strcmp(name, "dpram"))
		return NVA_REGSPACE_DPRAM;
	if (!strcmp(name, "pipe"))
		return NVA_REGSPACE_PIPE;
	if (!strcmp(name, "rdi"))
		return NVA_REGSPACE_RDI;
	if (!strcmp(name, "rdib"))
		return NVA_REGSPACE_RDIB;
	if (!strcmp(name, "vcomp_code"))
		return NVA_REGSPACE_VCOMP_CODE;
	if (!strcmp(name, "vcomp_reg"))
		return NVA_REGSPACE_VCOMP_REG;
	if (!strcmp(name, "macro_code"))
		return NVA_REGSPACE_MACRO_CODE;
	if (!strcmp(name, "xt"))
		return NVA_REGSPACE_XT;
	return NVA_REGSPACE_UNKNOWN;
}